

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Filter(Relation *this,string *expression)

{
  bool bVar1;
  bool bVar2;
  idx_t iVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  ParserOptions options_00;
  ClientContext *pCVar5;
  DatabaseInstance *pDVar6;
  reference pvVar7;
  ParserException *this_00;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar8;
  ParserOptions options;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expression_list;
  undefined6 uStack_76;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_60;
  undefined1 local_48 [32];
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&expression->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_48);
  pCVar5 = shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)local_48);
  bVar1 = (pCVar5->config).preserve_identifier_case;
  bVar2 = (pCVar5->config).integer_division;
  iVar3 = (pCVar5->config).max_expression_depth;
  pDVar6 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar5->db);
  options_00.integer_division = bVar2;
  options_00.preserve_identifier_case = bVar1;
  options_00._2_6_ = uStack_76;
  options_00.max_expression_depth = iVar3;
  options_00.extensions = &(pDVar6->config).parser_extensions;
  Parser::ParseExpressionList
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_60,in_RDX,options_00);
  if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if ((long)local_60.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                           *)&local_60,0);
    _Var4._M_head_impl =
         (pvVar7->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar7->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    Filter(this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)expression);
    if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_60);
    sVar8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Expected a single expression as filter condition","");
  ParserException::ParserException(this_00,(string *)local_48);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Relation::Filter(const string &expression) {
	auto expression_list = Parser::ParseExpressionList(expression, context->GetContext()->GetParserOptions());
	if (expression_list.size() != 1) {
		throw ParserException("Expected a single expression as filter condition");
	}
	return Filter(std::move(expression_list[0]));
}